

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O2

void chrono::utils::AddCylinderGeometry
               (ChBody *body,shared_ptr<chrono::ChMaterialSurface> *material,double radius,
               double hlen,ChVector<double> *pos,ChQuaternion<double> *rot,bool visualization,
               shared_ptr<chrono::ChVisualMaterial> *vis_material)

{
  double dVar1;
  undefined1 auVar2 [16];
  element_type *peVar3;
  undefined1 auVar4 [16];
  undefined8 in_XMM1_Qb;
  shared_ptr<chrono::ChCylinderShape> cylinder;
  shared_ptr<chrono::ChVisualModel> model;
  __shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2> local_138;
  double local_128;
  __shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> *local_120;
  shared_ptr<chrono::ChVisualShape> local_118;
  undefined1 local_108 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0 [3];
  __shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> local_d8;
  __shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> local_c8;
  ChFrame<double> local_b8;
  
  local_128 = radius;
  local_120 = &vis_material->
               super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>;
  local_f0[1]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)hlen;
  local_f0[2]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_XMM1_Qb;
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             &local_138,
             &(body->collision_model).
              super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>);
  peVar3 = local_138._M_ptr;
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> *)
             (local_108 + 0x10),
             &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  ChMatrix33<double>::Set_A_quaternion((ChMatrix33<double> *)&local_b8,rot);
  (*(peVar3->super_ChVisualShape)._vptr_ChVisualShape[8])
            (local_128,local_128,local_f0[1]._M_pi,peVar3,local_108 + 0x10,pos,&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
  if (visualization) {
    ChPhysicsItem::GetVisualModel((ChPhysicsItem *)&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8.coord);
    if ((pointer)local_b8._vptr_ChFrame == (pointer)0x0) {
      std::make_shared<chrono::ChVisualModel>();
      std::__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_c8,
                 (__shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2> *)&local_b8);
      ChPhysicsItem::AddVisualModel
                (&body->super_ChPhysicsItem,(shared_ptr<chrono::ChVisualModel> *)&local_c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8.coord);
    }
    chrono_types::make_shared<chrono::ChCylinderShape,_0>();
    ((local_138._M_ptr)->gcylinder).rad = local_128;
    auVar2._8_8_ = local_f0[2]._M_pi;
    auVar2._0_8_ = local_f0[1]._M_pi;
    ((local_138._M_ptr)->gcylinder).p1.m_data[0] = 0.0;
    ((local_138._M_ptr)->gcylinder).p1.m_data[1] = (double)local_f0[1]._M_pi;
    auVar4._8_8_ = 0x8000000000000000;
    auVar4._0_8_ = 0x8000000000000000;
    auVar4 = vxorpd_avx512vl(auVar2,auVar4);
    ((local_138._M_ptr)->gcylinder).p1.m_data[2] = 0.0;
    ((local_138._M_ptr)->gcylinder).p2.m_data[0] = 0.0;
    dVar1 = (double)vmovlpd_avx(auVar4);
    ((local_138._M_ptr)->gcylinder).p2.m_data[1] = dVar1;
    ((local_138._M_ptr)->gcylinder).p2.m_data[2] = 0.0;
    std::__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_d8,local_120);
    ChVisualShape::AddMaterial
              (&(local_138._M_ptr)->super_ChVisualShape,
               (shared_ptr<chrono::ChVisualMaterial> *)&local_d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
    ChPhysicsItem::GetVisualModel((ChPhysicsItem *)local_108);
    std::__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChCylinderShape,void>
              ((__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2> *)&local_118,
               &local_138);
    ChFrame<double>::ChFrame(&local_b8,pos,rot);
    ChVisualModel::AddShape((ChVisualModel *)local_108._0_8_,&local_118,&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_118.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
  }
  return;
}

Assistant:

void AddCylinderGeometry(ChBody* body,
                         std::shared_ptr<ChMaterialSurface> material,
                         double radius,
                         double hlen,
                         const ChVector<>& pos,
                         const ChQuaternion<>& rot,
                         bool visualization,
                         std::shared_ptr<ChVisualMaterial> vis_material) {
    body->GetCollisionModel()->AddCylinder(material, radius, radius, hlen, pos, rot);

    if (visualization) {
        if (!body->GetVisualModel()) {
            auto model = chrono_types::make_shared<ChVisualModel>();
            body->AddVisualModel(model);
        }
        auto cylinder = chrono_types::make_shared<ChCylinderShape>();
        cylinder->GetCylinderGeometry().rad = radius;
        cylinder->GetCylinderGeometry().p1 = ChVector<>(0, hlen, 0);
        cylinder->GetCylinderGeometry().p2 = ChVector<>(0, -hlen, 0);
        cylinder->AddMaterial(vis_material);
        body->GetVisualModel()->AddShape(cylinder, ChFrame<>(pos, rot));
    }
}